

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall
cmCacheManager::WritePropertyEntries(cmCacheManager *this,ostream *os,CacheIterator i)

{
  char **fout;
  char *pcVar1;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string key;
  allocator local_91;
  undefined1 local_90 [8];
  string helpstring;
  allocator local_59;
  string local_58;
  char *local_38;
  char *value;
  char **p;
  ostream *os_local;
  cmCacheManager *this_local;
  CacheIterator i_local;
  
  i_local.Container = (cmCacheManager *)i.Position._M_node;
  this_local = i.Container;
  p = (char **)os;
  os_local = (ostream *)this;
  for (value = (char *)PersistentProperties; *(long *)value != 0; value = value + 8) {
    pcVar1 = *(char **)value;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
    pcVar1 = CacheIterator::GetProperty((CacheIterator *)&this_local,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_38 = pcVar1;
    if (pcVar1 != (char *)0x0) {
      pcVar1 = *(char **)value;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_90,pcVar1,&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::__cxx11::string::operator+=((string *)local_90," property for variable: ");
      CacheIterator::GetName_abi_cxx11_
                ((string *)((long)&key.field_2 + 8),(CacheIterator *)&this_local);
      std::__cxx11::string::operator+=((string *)local_90,(string *)(key.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
      OutputHelpString((ostream *)p,(string *)local_90);
      CacheIterator::GetName_abi_cxx11_((string *)local_d8,(CacheIterator *)&this_local);
      std::__cxx11::string::operator+=((string *)local_d8,"-");
      std::__cxx11::string::operator+=((string *)local_d8,*(char **)value);
      OutputKey((ostream *)p,(string *)local_d8);
      std::operator<<((ostream *)p,":INTERNAL=");
      fout = p;
      pcVar1 = local_38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,pcVar1,&local_f9);
      OutputValue((ostream *)fout,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::operator<<((ostream *)p,"\n");
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os, CacheIterator i)
{
  for (const char** p = this->PersistentProperties; *p; ++p) {
    if (const char* value = i.GetProperty(*p)) {
      std::string helpstring = *p;
      helpstring += " property for variable: ";
      helpstring += i.GetName();
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = i.GetName();
      key += "-";
      key += *p;
      this->OutputKey(os, key);
      os << ":INTERNAL=";
      this->OutputValue(os, value);
      os << "\n";
    }
  }
}